

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O1

void Abc_NtkRetimeBackwardInitialFinish
               (Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew,Vec_Int_t *vValuesOld,int fVerbose)

{
  void *pvVar1;
  Abc_Obj_t *pObj;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vValues;
  long lVar4;
  
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8)) {
        pObj = *(Abc_Obj_t **)((long)pvVar1 + 0x40);
        pFanin = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PI);
        Abc_ObjAddFanin(pObj,pFanin);
      }
      lVar4 = lVar4 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar4 < pVVar3->nSize);
  }
  Abc_NtkAddDummyPiNames(pNtkNew);
  Abc_NtkAddDummyPoNames(pNtkNew);
  iVar2 = Abc_NtkCheck(pNtkNew);
  if (iVar2 == 0) {
    fwrite("Abc_NtkRetimeBackwardInitialFinish(): Network check has failed.\n",0x40,1,_stdout);
  }
  vValues = Abc_NtkRetimeInitialValues(pNtkNew,vValuesOld,fVerbose);
  Abc_NtkRetimeInsertLatchValues(pNtk,vValues);
  if (vValues != (Vec_Int_t *)0x0) {
    if (vValues->pArray != (int *)0x0) {
      free(vValues->pArray);
      vValues->pArray = (int *)0x0;
    }
    free(vValues);
    return;
  }
  return;
}

Assistant:

void Abc_NtkRetimeBackwardInitialFinish( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew, Vec_Int_t * vValuesOld, int fVerbose )
{
    Vec_Int_t * vValuesNew;
    Abc_Obj_t * pObj;
    int i;
    // create PIs corresponding to the initial values
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            Abc_ObjAddFanin( pObj->pCopy, Abc_NtkCreatePi(pNtkNew) );
    // assign dummy node names
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    // check the network
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkRetimeBackwardInitialFinish(): Network check has failed.\n" );
    // derive new initial values
    vValuesNew = Abc_NtkRetimeInitialValues( pNtkNew, vValuesOld, fVerbose );
    // insert new initial values
    Abc_NtkRetimeInsertLatchValues( pNtk, vValuesNew );
    if ( vValuesNew ) Vec_IntFree( vValuesNew );
}